

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processTimingTick(CommonCore *this,ActionMessage *cmd)

{
  string_view name;
  string_view name_00;
  string_view message;
  string_view message_00;
  bool bVar1;
  FederateStates FVar2;
  BrokerState BVar3;
  __int_type_conflict _Var4;
  FederateState *pFVar5;
  long in_RSI;
  CommonCore *in_RDI;
  __sv_type _Var6;
  FedInfo fed;
  const_iterator __end3;
  const_iterator __begin3;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range3;
  ActionMessage bye;
  time_point now;
  CommonCore *in_stack_00000318;
  TimeoutMonitor *in_stack_00000320;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd50;
  FedInfo *this_00;
  action_t in_stack_fffffffffffffd5c;
  ActionMessage *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  CommonCore *in_stack_fffffffffffffe20;
  FedInfo local_1b8;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_1a0 [2];
  undefined1 in_stack_fffffffffffffe9b;
  int in_stack_fffffffffffffe9c;
  BrokerBase *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  GlobalFederateId in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  GlobalFederateId in_stack_fffffffffffffebc;
  ActionMessage *local_98;
  FederateState *pFStack_90;
  GlobalFederateId local_70;
  __unspec local_69;
  baseType local_68;
  baseType local_60;
  rep local_58;
  rep local_50;
  type local_41;
  undefined8 local_40;
  baseType local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  size_t local_28;
  char *in_stack_ffffffffffffffe0;
  GlobalBrokerId in_stack_ffffffffffffffe8;
  GlobalFederateId in_stack_ffffffffffffffec;
  
  bVar1 = BrokerBase::isReasonForTick(*(uint32_t *)(in_RSI + 4),PING_RESPONSE);
  if (((bVar1) || (bVar1 = BrokerBase::isReasonForTick(*(uint32_t *)(in_RSI + 4),NO_COMMS), bVar1))
     && (BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x54f759), BVar3 == OPERATING)) {
    std::unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
    operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_> *)
               0x54f774);
    TimeoutMonitor::tick(in_stack_00000320,in_stack_00000318);
    _Var4 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffd48);
    if (5 < _Var4) {
      in_stack_ffffffffffffffe8.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xffffffffffffffec,in_stack_ffffffffffffffe8);
      getIdentifier_abi_cxx11_(in_RDI);
      _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd40);
      local_28 = _Var6._M_len;
      in_stack_ffffffffffffffe0 = _Var6._M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      name._M_len._4_4_ = in_stack_fffffffffffffeac.gid;
      name._M_len._0_4_ = in_stack_fffffffffffffea8;
      name._M_str = in_stack_fffffffffffffeb0;
      message._M_str._0_4_ = in_stack_ffffffffffffffe8.gid;
      message._M_len = (size_t)in_stack_ffffffffffffffe0;
      message._M_str._4_4_ = in_stack_ffffffffffffffec.gid;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffebc,in_stack_fffffffffffffe9c,name,
                 message,(bool)in_stack_fffffffffffffe9b);
      in_stack_fffffffffffffd38.internalTimeCode = local_38;
      in_stack_fffffffffffffd40 = local_30;
    }
  }
  bVar1 = BrokerBase::isReasonForTick(*(uint32_t *)(in_RSI + 4),QUERY_TIMEOUT);
  if (bVar1) {
    checkQueryTimeouts(in_stack_fffffffffffffe20);
  }
  bVar1 = BrokerBase::isReasonForTick(*(uint32_t *)(in_RSI + 4),DISCONNECT_TIMEOUT);
  if (bVar1) {
    local_40 = std::chrono::_V2::steady_clock::now();
    local_50 = (rep)std::chrono::operator-
                              (in_stack_fffffffffffffd48,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_fffffffffffffd40);
    local_68 = (in_RDI->super_BrokerBase).tickTimer.internalTimeCode;
    local_60 = (baseType)::operator*(0,in_stack_fffffffffffffd38);
    local_58 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                              ((TimeRepresentation<count_time<9,_long>_> *)
                               in_stack_fffffffffffffd38.internalTimeCode);
    local_41 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                                (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffd60)
    ;
    CLI::std::__cmp_cat::__unspec::__unspec(&local_69,(__unspec *)0x0);
    bVar1 = CLI::std::operator>(local_41);
    if (bVar1) {
      GlobalFederateId::GlobalFederateId
                (&local_70,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      getIdentifier_abi_cxx11_(in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd40);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      name_00._M_len._4_4_ = in_stack_fffffffffffffeac.gid;
      name_00._M_len._0_4_ = in_stack_fffffffffffffea8;
      name_00._M_str = in_stack_fffffffffffffeb0;
      message_00._M_str._0_4_ = in_stack_ffffffffffffffe8.gid;
      message_00._M_len = (size_t)in_stack_ffffffffffffffe0;
      message_00._M_str._4_4_ = in_stack_ffffffffffffffec.gid;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffebc,in_stack_fffffffffffffe9c,
                 name_00,message_00,(bool)in_stack_fffffffffffffe9b);
      ActionMessage::ActionMessage(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffeac,(GlobalBrokerId)0x0);
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
             *)pFStack_90);
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
           *)pFStack_90);
      while (bVar1 = gmlc::containers::
                     BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
                     operator!=((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                                 *)&local_1a0[1].offset,local_1a0), bVar1) {
        in_stack_fffffffffffffd60 =
             (ActionMessage *)
             gmlc::containers::
             BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator*
                       ((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                        &local_1a0[1].offset);
        local_1b8.fed = *(FederateState **)in_stack_fffffffffffffd60;
        local_1b8._8_8_ = *(undefined8 *)&in_stack_fffffffffffffd60->source_id;
        FedInfo::operator->(&local_1b8);
        FVar2 = FederateState::getState((FederateState *)0x54fac0);
        in_stack_fffffffffffffd5c = CONCAT13(FVar2,(int3)in_stack_fffffffffffffd5c);
        if (FVar2 != FINISHED) {
          this_00 = &local_1b8;
          pFVar5 = FedInfo::operator->(this_00);
          std::atomic<helics::GlobalFederateId>::load(&pFVar5->global_id,seq_cst);
          FedInfo::operator->(this_00);
          FederateState::addAction(pFStack_90,local_98);
        }
        gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
        operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                   pFStack_90);
      }
      ActionMessage::ActionMessage(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      BrokerBase::addActionMessage((BrokerBase *)pFStack_90,local_98);
      ActionMessage::~ActionMessage((ActionMessage *)pFStack_90);
      ActionMessage::~ActionMessage((ActionMessage *)pFStack_90);
    }
  }
  return;
}

Assistant:

void CommonCore::processTimingTick(ActionMessage& cmd)
{
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::PING_RESPONSE) ||
        isReasonForTick(cmd.messageID, TickForwardingReasons::NO_COMMS)) {
        if (getBrokerState() == BrokerState::OPERATING) {
            timeoutMon->tick(this);
            LOG_SUMMARY(global_broker_id_local, getIdentifier(), " core tick");
        }
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::QUERY_TIMEOUT)) {
        checkQueryTimeouts();
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::DISCONNECT_TIMEOUT)) {
        auto now = std::chrono::steady_clock::now();
        if (now - disconnectTime > (3 * tickTimer).to_ms()) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        " disconnect Timer expired forcing disconnect");
            ActionMessage bye(CMD_DISCONNECT_FED_ACK);
            bye.source_id = parent_broker_id;
            for (FedInfo fed : loopFederates) {
                if (fed->getState() != FederateStates::FINISHED) {
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                }
            }
            addActionMessage(CMD_STOP);
        }
    }
}